

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O3

BinaryenExpressionRef
BinaryenBlock(BinaryenModuleRef module,char *name,BinaryenExpressionRef *children,
             BinaryenIndex numChildren,BinaryenType type)

{
  Block *this;
  IString *this_00;
  undefined1 reuse;
  ulong uVar2;
  string_view sVar3;
  BinaryenIndex BVar1;
  
  BVar1 = numChildren;
  this = (Block *)MixedArena::allocSpace(&module->allocator,0x40,8);
  reuse = (undefined1)BVar1;
  (this->super_SpecificExpression<(wasm::Expression::Id)1>).super_Expression._id = BlockId;
  (this->super_SpecificExpression<(wasm::Expression::Id)1>).super_Expression.type.id = 0;
  (this->name).super_IString.str._M_len = 0;
  (this->name).super_IString.str._M_str = (char *)0x0;
  (this->list).super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.data =
       (Expression **)0x0;
  (this->list).super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
  usedElements = 0;
  (this->list).super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
  allocatedElements = 0;
  (this->list).allocator = &module->allocator;
  if (name != (char *)0x0) {
    this_00 = (IString *)strlen(name);
    sVar3._M_str = (char *)0x0;
    sVar3._M_len = (size_t)name;
    sVar3 = wasm::IString::interned(this_00,sVar3,(bool)reuse);
    (this->name).super_IString.str = sVar3;
  }
  if (numChildren != 0) {
    uVar2 = 0;
    do {
      ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
                (&(this->list).
                  super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>,
                 children[uVar2]);
      uVar2 = uVar2 + 1;
    } while (numChildren != uVar2);
  }
  if (type == 0xffffffffffffffff) {
    wasm::Block::finalize(this);
  }
  else {
    wasm::Block::finalize(this,(Type)type);
  }
  return (BinaryenExpressionRef)this;
}

Assistant:

BinaryenExpressionRef BinaryenBlock(BinaryenModuleRef module,
                                    const char* name,
                                    BinaryenExpressionRef* children,
                                    BinaryenIndex numChildren,
                                    BinaryenType type) {
  auto* ret = ((Module*)module)->allocator.alloc<Block>();
  if (name) {
    ret->name = name;
  }
  for (BinaryenIndex i = 0; i < numChildren; i++) {
    ret->list.push_back((Expression*)children[i]);
  }
  if (type != BinaryenTypeAuto()) {
    ret->finalize(Type(type));
  } else {
    ret->finalize();
  }
  return static_cast<Expression*>(ret);
}